

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

void allocateProof2(proof2_t *proof,picnic_instance_t *params)

{
  void *pvVar1;
  long in_RSI;
  undefined8 *in_RDI;
  
  *(undefined2 *)(in_RDI + 6) = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  pvVar1 = malloc((ulong)*(byte *)(in_RSI + 6));
  in_RDI[3] = pvVar1;
  pvVar1 = malloc((ulong)*(byte *)(in_RSI + 8));
  in_RDI[4] = pvVar1;
  pvVar1 = malloc((ulong)*(byte *)(in_RSI + 9));
  in_RDI[2] = pvVar1;
  pvVar1 = malloc((ulong)*(byte *)(in_RSI + 9));
  in_RDI[5] = pvVar1;
  return;
}

Assistant:

void allocateProof2(proof2_t* proof, const picnic_instance_t* params) {
  proof->unOpenedIndex = 0;
  proof->seedInfo      = NULL; // Sign/verify code sets it
  proof->seedInfoLen   = 0;
  proof->C             = malloc(params->digest_size);
  proof->input         = malloc(params->input_output_size);
  proof->aux           = malloc(params->view_size);
  proof->msgs          = malloc(params->view_size);
}